

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# row_matcher.cpp
# Opt level: O3

idx_t duckdb::TemplatedMatch<true,unsigned_char,duckdb::LessThanEquals>
                (Vector *param_1,TupleDataVectorFormat *lhs_format,SelectionVector *sel,idx_t count,
                TupleDataLayout *rhs_layout,Vector *rhs_row_locations,idx_t col_idx,
                vector<duckdb::MatchFunction,_true> *param_8,SelectionVector *no_match_sel,
                idx_t *no_match_count)

{
  data_ptr_t pdVar1;
  SelectionVector *pSVar2;
  data_ptr_t pdVar3;
  value_type vVar4;
  sel_t *psVar5;
  sel_t *psVar6;
  unsigned_long *puVar7;
  const_reference pvVar8;
  idx_t iVar9;
  idx_t iVar10;
  idx_t iVar11;
  idx_t iVar12;
  idx_t iVar13;
  uchar *lhs_data;
  uchar **rhs_locations;
  bool bVar14;
  
  if ((lhs_format->unified).validity.super_TemplatedValidityMask<unsigned_long>.validity_mask ==
      (unsigned_long *)0x0) {
    pSVar2 = (lhs_format->unified).sel;
    pdVar1 = (lhs_format->unified).data;
    pdVar3 = rhs_row_locations->data;
    pvVar8 = vector<unsigned_long,_true>::operator[](&rhs_layout->offsets,col_idx);
    if (count != 0) {
      vVar4 = *pvVar8;
      iVar10 = *no_match_count;
      psVar5 = sel->sel_vector;
      psVar6 = pSVar2->sel_vector;
      iVar9 = 0;
      iVar11 = 0;
      do {
        iVar12 = iVar11;
        if (psVar5 != (sel_t *)0x0) {
          iVar12 = (idx_t)psVar5[iVar11];
        }
        iVar13 = iVar12;
        if (psVar6 != (sel_t *)0x0) {
          iVar13 = (idx_t)psVar6[iVar12];
        }
        if (((1 << ((byte)col_idx & 7) &
             (uint)*(byte *)(*(long *)(pdVar3 + iVar12 * 8) + (col_idx >> 3))) == 0) ||
           (*(byte *)(*(long *)(pdVar3 + iVar12 * 8) + vVar4) < pdVar1[iVar13])) {
          *no_match_count = iVar10 + 1;
          no_match_sel->sel_vector[iVar10] = (sel_t)iVar12;
          iVar10 = iVar10 + 1;
        }
        else {
          psVar5[iVar9] = (sel_t)iVar12;
          iVar9 = iVar9 + 1;
        }
        iVar11 = iVar11 + 1;
      } while (count != iVar11);
      return iVar9;
    }
  }
  else {
    pdVar1 = rhs_row_locations->data;
    pSVar2 = (lhs_format->unified).sel;
    pdVar3 = (lhs_format->unified).data;
    pvVar8 = vector<unsigned_long,_true>::operator[](&rhs_layout->offsets,col_idx);
    if (count != 0) {
      vVar4 = *pvVar8;
      iVar10 = *no_match_count;
      psVar5 = sel->sel_vector;
      psVar6 = pSVar2->sel_vector;
      puVar7 = (lhs_format->unified).validity.super_TemplatedValidityMask<unsigned_long>.
               validity_mask;
      iVar9 = 0;
      iVar11 = 0;
      do {
        iVar12 = iVar11;
        if (psVar5 != (sel_t *)0x0) {
          iVar12 = (idx_t)psVar5[iVar11];
        }
        iVar13 = iVar12;
        if (psVar6 != (sel_t *)0x0) {
          iVar13 = (idx_t)psVar6[iVar12];
        }
        if (puVar7 == (unsigned_long *)0x0) {
          bVar14 = false;
        }
        else {
          bVar14 = (puVar7[iVar13 >> 6] >> (iVar13 & 0x3f) & 1) == 0;
        }
        if (((bVar14) ||
            (((uint)*(byte *)(*(long *)(pdVar1 + iVar12 * 8) + (col_idx >> 3)) &
             1 << ((byte)col_idx & 7)) == 0)) ||
           (*(byte *)(*(long *)(pdVar1 + iVar12 * 8) + vVar4) < pdVar3[iVar13])) {
          *no_match_count = iVar10 + 1;
          no_match_sel->sel_vector[iVar10] = (sel_t)iVar12;
          iVar10 = iVar10 + 1;
        }
        else {
          psVar5[iVar9] = (sel_t)iVar12;
          iVar9 = iVar9 + 1;
        }
        iVar11 = iVar11 + 1;
      } while (count != iVar11);
      return iVar9;
    }
  }
  return 0;
}

Assistant:

static idx_t TemplatedMatch(Vector &, const TupleDataVectorFormat &lhs_format, SelectionVector &sel, const idx_t count,
                            const TupleDataLayout &rhs_layout, Vector &rhs_row_locations, const idx_t col_idx,
                            const vector<MatchFunction> &, SelectionVector *no_match_sel, idx_t &no_match_count) {
	if (lhs_format.unified.validity.AllValid()) {
		return TemplatedMatchLoop<NO_MATCH_SEL, T, OP, true>(lhs_format, sel, count, rhs_layout, rhs_row_locations,
		                                                     col_idx, no_match_sel, no_match_count);
	} else {
		return TemplatedMatchLoop<NO_MATCH_SEL, T, OP, false>(lhs_format, sel, count, rhs_layout, rhs_row_locations,
		                                                      col_idx, no_match_sel, no_match_count);
	}
}